

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O1

void __thiscall
CLogicSocket::SendNoBodyPkgToClient
          (CLogicSocket *this,LPSTRUC_MSG_HEADER pMsgHeader,unsigned_short iMsgCode)

{
  char *pcVar1;
  ushort uVar2;
  size_t sVar3;
  CMemory *this_00;
  char *psendbuf;
  
  this_00 = CMemory::GetInstance();
  psendbuf = (char *)CMemory::AllocMemory
                               (this_00,(int)(this->super_CSocekt).m_iLenPkgHeader +
                                        (int)(this->super_CSocekt).m_iLenMsgHeader,false);
  memcpy(psendbuf,pMsgHeader,(this->super_CSocekt).m_iLenMsgHeader);
  sVar3 = (this->super_CSocekt).m_iLenMsgHeader;
  *(unsigned_short *)(psendbuf + sVar3 + 2) = iMsgCode << 8 | iMsgCode >> 8;
  uVar2 = (ushort)(this->super_CSocekt).m_iLenPkgHeader;
  *(ushort *)(psendbuf + sVar3) = uVar2 << 8 | uVar2 >> 8;
  pcVar1 = psendbuf + sVar3 + 4;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  CSocekt::msgSend(&this->super_CSocekt,psendbuf);
  return;
}

Assistant:

void CLogicSocket::SendNoBodyPkgToClient(LPSTRUC_MSG_HEADER pMsgHeader, unsigned short iMsgCode)
{
    CMemory *p_memory = CMemory::GetInstance();

    char *p_sendbuf = (char *)p_memory->AllocMemory(m_iLenMsgHeader + m_iLenPkgHeader, false);
    char *p_tmpbuf = p_sendbuf;
    //加入消息头，内含连接的指针，连接的序列号
    memcpy(p_tmpbuf, pMsgHeader, m_iLenMsgHeader);
    p_tmpbuf += m_iLenMsgHeader;

    //包头,内含消息码，包体长度，crc校验值
    LPCOMM_PKG_HEADER pKgHeader = (LPCOMM_PKG_HEADER)p_tmpbuf;
    pKgHeader->msgCode = htons(iMsgCode);
    pKgHeader->pkgLen = htons(m_iLenPkgHeader);
    pKgHeader->crc32 = 0;
    msgSend(p_sendbuf);

}